

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementContentPtr xmlCopyDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  xmlChar *pxVar1;
  _xmlNode *p_Var2;
  xmlElementContentPtr pxVar3;
  _xmlElementContent *__s;
  xmlDictPtr local_40;
  xmlDictPtr dict;
  xmlElementContentPtr tmp;
  xmlElementContentPtr prev;
  xmlElementContentPtr ret;
  xmlElementContentPtr cur_local;
  xmlDocPtr doc_local;
  
  local_40 = (xmlDictPtr)0x0;
  if (cur == (xmlElementContentPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if (doc != (xmlDocPtr)0x0) {
      local_40 = doc->dict;
    }
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x30);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x30);
      *(xmlElementContentType *)&doc_local->_private = cur->type;
      *(xmlElementContentOccur *)((long)&doc_local->_private + 4) = cur->ocur;
      if (cur->name != (xmlChar *)0x0) {
        if (local_40 == (xmlDictPtr)0x0) {
          pxVar1 = xmlStrdup(cur->name);
          *(xmlChar **)&doc_local->type = pxVar1;
        }
        else {
          pxVar1 = xmlDictLookup(local_40,cur->name,-1);
          *(xmlChar **)&doc_local->type = pxVar1;
        }
      }
      if (cur->prefix != (xmlChar *)0x0) {
        if (local_40 == (xmlDictPtr)0x0) {
          p_Var2 = (_xmlNode *)xmlStrdup(cur->prefix);
          doc_local->parent = p_Var2;
        }
        else {
          p_Var2 = (_xmlNode *)xmlDictLookup(local_40,cur->prefix,-1);
          doc_local->parent = p_Var2;
        }
      }
      if (cur->c1 != (_xmlElementContent *)0x0) {
        pxVar3 = xmlCopyDocElementContent(doc,cur->c1);
        doc_local->name = (char *)pxVar3;
      }
      if ((_xmlElementContent *)doc_local->name != (_xmlElementContent *)0x0) {
        ((_xmlElementContent *)doc_local->name)->parent = (_xmlElementContent *)doc_local;
      }
      if (cur->c2 != (_xmlElementContent *)0x0) {
        tmp = (xmlElementContentPtr)doc_local;
        for (ret = cur->c2; ret != (xmlElementContentPtr)0x0; ret = ret->c2) {
          __s = (_xmlElementContent *)(*xmlMalloc)(0x30);
          if (__s == (_xmlElementContent *)0x0) {
            xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
            return (xmlElementContentPtr)doc_local;
          }
          memset(__s,0,0x30);
          __s->type = ret->type;
          __s->ocur = ret->ocur;
          tmp->c2 = __s;
          __s->parent = tmp;
          if (ret->name != (xmlChar *)0x0) {
            if (local_40 == (xmlDictPtr)0x0) {
              pxVar1 = xmlStrdup(ret->name);
              __s->name = pxVar1;
            }
            else {
              pxVar1 = xmlDictLookup(local_40,ret->name,-1);
              __s->name = pxVar1;
            }
          }
          if (ret->prefix != (xmlChar *)0x0) {
            if (local_40 == (xmlDictPtr)0x0) {
              pxVar1 = xmlStrdup(ret->prefix);
              __s->prefix = pxVar1;
            }
            else {
              pxVar1 = xmlDictLookup(local_40,ret->prefix,-1);
              __s->prefix = pxVar1;
            }
          }
          if (ret->c1 != (_xmlElementContent *)0x0) {
            pxVar3 = xmlCopyDocElementContent(doc,ret->c1);
            __s->c1 = pxVar3;
          }
          if (__s->c1 != (_xmlElementContent *)0x0) {
            __s->c1->parent = (_xmlElementContent *)doc_local;
          }
          tmp = __s;
        }
      }
    }
  }
  return (xmlElementContentPtr)doc_local;
}

Assistant:

xmlElementContentPtr
xmlCopyDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlElementContentPtr ret = NULL, prev = NULL, tmp;
    xmlDictPtr dict = NULL;

    if (cur == NULL) return(NULL);

    if (doc != NULL)
        dict = doc->dict;

    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = cur->type;
    ret->ocur = cur->ocur;
    if (cur->name != NULL) {
	if (dict)
	    ret->name = xmlDictLookup(dict, cur->name, -1);
	else
	    ret->name = xmlStrdup(cur->name);
    }

    if (cur->prefix != NULL) {
	if (dict)
	    ret->prefix = xmlDictLookup(dict, cur->prefix, -1);
	else
	    ret->prefix = xmlStrdup(cur->prefix);
    }
    if (cur->c1 != NULL)
        ret->c1 = xmlCopyDocElementContent(doc, cur->c1);
    if (ret->c1 != NULL)
	ret->c1->parent = ret;
    if (cur->c2 != NULL) {
        prev = ret;
	cur = cur->c2;
	while (cur != NULL) {
	    tmp = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
	    if (tmp == NULL) {
		xmlVErrMemory(NULL, "malloc failed");
		return(ret);
	    }
	    memset(tmp, 0, sizeof(xmlElementContent));
	    tmp->type = cur->type;
	    tmp->ocur = cur->ocur;
	    prev->c2 = tmp;
	    tmp->parent = prev;
	    if (cur->name != NULL) {
		if (dict)
		    tmp->name = xmlDictLookup(dict, cur->name, -1);
		else
		    tmp->name = xmlStrdup(cur->name);
	    }

	    if (cur->prefix != NULL) {
		if (dict)
		    tmp->prefix = xmlDictLookup(dict, cur->prefix, -1);
		else
		    tmp->prefix = xmlStrdup(cur->prefix);
	    }
	    if (cur->c1 != NULL)
	        tmp->c1 = xmlCopyDocElementContent(doc,cur->c1);
	    if (tmp->c1 != NULL)
		tmp->c1->parent = ret;
	    prev = tmp;
	    cur = cur->c2;
	}
    }
    return(ret);
}